

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.h
# Opt level: O1

bool jbcoin::operator<(STAmount *lhs,STAmount *rhs)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  if (lhs->mIsNative == rhs->mIsNative) {
    lVar4 = 0;
    do {
      if (*(char *)((long)(lhs->mIssue).currency.pn + lVar4) !=
          *(char *)((long)(rhs->mIssue).currency.pn + lVar4)) goto LAB_001b2fcc;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x14);
    lVar4 = 0x14;
LAB_001b2fcc:
    if (lVar4 == 0x14) {
      bVar1 = lhs->mIsNegative;
      if (bVar1 != rhs->mIsNegative) {
        return bVar1;
      }
      uVar2 = lhs->mValue;
      if (uVar2 == 0) {
        if (rhs->mIsNegative == false) {
          return rhs->mValue != 0;
        }
      }
      else {
        uVar3 = rhs->mValue;
        if (uVar3 != 0) {
          if (rhs->mOffset < lhs->mOffset) {
            return bVar1;
          }
          if (lhs->mOffset < rhs->mOffset) {
            return (bool)(bVar1 ^ 1);
          }
          if (uVar3 < uVar2) {
            return bVar1;
          }
          return (bool)((bVar1 ^ 1U) & uVar2 < uVar3);
        }
      }
      return false;
    }
  }
  Throw<std::runtime_error,char_const(&)[45]>
            ((char (*) [45])"Can\'t compare amounts that are\'t comparable!");
}

Assistant:

std::uint64_t mantissa() const noexcept { return mValue; }